

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_645bf::ParserImpl::ParseExp
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *left,TokenDetail op,
          int left_priority)

{
  uint uVar1;
  String *pSVar2;
  GCObject *pGVar3;
  _Manager_type p_Var4;
  SyntaxTree *pSVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TokenDetail op_00;
  TokenDetail *pTVar8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar9;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar10;
  ParseException *this_00;
  int in_ECX;
  char *pcVar11;
  undefined4 in_register_00000014;
  long *plVar12;
  char *__assertion;
  int iVar13;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_78;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_70;
  String *local_68;
  long *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  plVar12 = (long *)CONCAT44(in_register_00000014,left_priority);
  LookAhead((ParserImpl *)left);
  iVar13 = *(int *)&left[8]._M_t.
                    super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                    .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  uVar1 = iVar13 - 0x106;
  if (uVar1 < 0x18) {
    if ((0x839045U >> (uVar1 & 0x1f) & 1) != 0) {
LAB_00134588:
      pTVar8 = LookAhead((ParserImpl *)left);
      iVar13 = pTVar8->token_;
      uVar1 = iVar13 - 0x106;
      if (uVar1 < 0x18) {
        if ((0x831041U >> (uVar1 & 0x1f) & 1) != 0) {
          aVar9.str_ = (String *)operator_new(0x30);
          pTVar8 = NextToken((ParserImpl *)left);
          ((aVar9.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__SyntaxTree_0015b2a8;
          pSVar2 = pTVar8->module_;
          pcVar11 = *(char **)&pTVar8->line_;
          p_Var4 = *(_Manager_type *)&pTVar8->token_;
          ((aVar9.str_)->super_GCObject).next_ = (GCObject *)pTVar8->field_0;
          *(String **)
           &(((CharInStream *)&((aVar9.str_)->super_GCObject).field_0x10)->super__Function_base).
            _M_functor = pSVar2;
          ((aVar9.str_)->field_1).str_ = pcVar11;
          *(_Manager_type *)((long)&(aVar9.str_)->field_1 + 8) = p_Var4;
          *(_Invoker_type *)&(aVar9.str_)->length_ = (_Invoker_type)0x0;
          goto LAB_00134731;
        }
        if (uVar1 == 2) {
          NextToken((ParserImpl *)left);
          if (*(int *)&left[4]._M_t.
                       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                       .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl != 0x108) {
            __assertion = "current_.token_ == Token_Function";
            pcVar11 = 
            "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionDef()";
            uVar1 = 0x7e;
LAB_00134953:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,uVar1,pcVar11);
          }
          ParseFunctionBody((ParserImpl *)&local_78);
          aVar9 = local_78;
          goto LAB_00134731;
        }
        if (uVar1 != 0xf) goto LAB_001345f6;
      }
      else {
LAB_001345f6:
        if (iVar13 != 0x28) {
          if (iVar13 != 0x7b) {
            this_00 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException
                      (this_00,"unexpect token for exp.",(TokenDetail *)(left + 5));
LAB_00134976:
            __cxa_throw(this_00,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          ParseTableConstructor((ParserImpl *)&local_78);
          aVar9 = local_78;
          goto LAB_00134731;
        }
      }
      ParsePrefixExp((ParserImpl *)&local_78,(PrefixExpType *)left);
      aVar9 = local_78;
      goto LAB_00134731;
    }
    if (uVar1 != 7) goto LAB_00134635;
  }
  else {
LAB_00134635:
    if (iVar13 != 0x23) {
      if ((iVar13 == 0x28) || (iVar13 == 0x7b)) goto LAB_00134588;
      if (iVar13 != 0x2d) {
        this_00 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (this_00,"unexpect token for exp.",(TokenDetail *)(left + 5));
        goto LAB_00134976;
      }
    }
  }
  NextToken((ParserImpl *)left);
  aVar9.str_ = (String *)operator_new(0x30);
  ((aVar9.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__UnaryExpression_0015b328;
  ((aVar9.str_)->super_GCObject).next_ = (GCObject *)0x0;
  pSVar5 = left[2]._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  uVar6 = *(undefined8 *)
           ((long)&left[2]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
  uVar7 = *(undefined8 *)
           ((long)&left[3]._M_t.
                   super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                   .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl + 4);
  local_60 = (long *)0x0;
  *(SyntaxTree **)
   &(((CharInStream *)&((aVar9.str_)->super_GCObject).field_0x10)->super__Function_base)._M_functor
       = left[1]._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  ((aVar9.str_)->field_1).str_ = (char *)pSVar5;
  *(undefined8 *)((long)&(aVar9.str_)->field_1 + 4) = uVar6;
  *(undefined8 *)((long)&(aVar9.str_)->field_1 + 0xc) = uVar7;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0x11e;
  op_00._28_4_ = uStack_3c;
  op_00.token_ = 0x11e;
  op_00.line_ = 0;
  op_00.column_ = 0;
  op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
  op_00.module_ = (String *)0x0;
  ParseExp((ParserImpl *)&local_78,left,op_00,(int)&local_60);
  pSVar2 = (String *)((aVar9.str_)->super_GCObject).next_;
  ((aVar9.str_)->super_GCObject).next_ = (GCObject *)local_78;
  if (pSVar2 != (String *)0x0) {
    (*(pSVar2->super_GCObject)._vptr_GCObject[1])();
  }
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  local_60 = (long *)0x0;
LAB_00134731:
  do {
    pTVar8 = LookAhead((ParserImpl *)left);
    iVar13 = pTVar8->token_;
    if (iVar13 - 0x118U < 4) {
LAB_0013478c:
      iVar13 = 0x32;
    }
    else if ((iVar13 == 0x25) || (iVar13 == 0x2a)) {
LAB_00134788:
      iVar13 = 0x50;
    }
    else if ((iVar13 == 0x2b) || (iVar13 == 0x2d)) {
      iVar13 = 0x46;
    }
    else if (iVar13 == 0x11c) {
      iVar13 = 0x3c;
    }
    else {
      if ((iVar13 == 0x3c) || (iVar13 == 0x3e)) goto LAB_0013478c;
      if (iVar13 == 0x5e) {
        iVar13 = 100;
      }
      else if (iVar13 == 0x100) {
        iVar13 = 0x28;
      }
      else if (iVar13 == 0x10e) {
        iVar13 = 0x1e;
      }
      else {
        if (iVar13 == 0x2f) goto LAB_00134788;
        iVar13 = 0;
      }
    }
    if (iVar13 <= in_ECX) {
      aVar10 = aVar9;
      if (iVar13 != in_ECX) {
        pSVar2 = (String *)*plVar12;
        if (pSVar2 != (String *)0x0) {
          aVar10.str_ = (String *)operator_new(0x38);
          *plVar12 = 0;
          ((aVar10.str_)->super_GCObject)._vptr_GCObject =
               (_func_int **)&PTR__BinaryExpression_0015b2e8;
          ((aVar10.str_)->super_GCObject).next_ = (GCObject *)pSVar2;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &(((CharInStream *)&((aVar10.str_)->super_GCObject).field_0x10)->super__Function_base).
            _M_functor = (String *)aVar9;
          ((aVar10.str_)->field_1).str_ = (char *)op.field_0;
          *(String **)((long)&(aVar10.str_)->field_1 + 8) = op.module_;
          *(undefined8 *)&(aVar10.str_)->length_ = op._16_8_;
          (aVar10.str_)->hash_ = op._24_8_;
        }
        goto LAB_001348ef;
      }
      pTVar8 = LookAhead((ParserImpl *)left);
      if (pTVar8->token_ != 0x5e) break;
    }
    local_70 = aVar9;
    pTVar8 = NextToken((ParserImpl *)left);
    ParseExp((ParserImpl *)&local_78,left,*pTVar8,(int)&local_70);
    aVar9 = local_78;
    if ((Lexer *)local_70.str_ != (Lexer *)0x0) {
      (*(code *)(((State *)((local_70.str_)->super_GCObject)._vptr_GCObject)->string_pool_)._M_t.
                super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t
                .super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
                super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
    }
    local_70.number_ = 0.0;
  } while( true );
  if (in_ECX == 0) {
LAB_001348ef:
    this->lexer_ = (Lexer *)aVar10;
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           this;
  }
  pGVar3 = (GCObject *)*plVar12;
  if (pGVar3 != (GCObject *)0x0) {
    local_68 = (String *)operator_new(0x38);
    *plVar12 = 0;
    (local_68->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__BinaryExpression_0015b2e8;
    (local_68->super_GCObject).next_ = pGVar3;
    *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(local_68->super_GCObject).field_0x10 =
         (String *)aVar9;
    (local_68->field_1).str_ = (char *)op.field_0;
    *(String **)((long)&local_68->field_1 + 8) = op.module_;
    local_68->length_ = op.line_;
    *(int *)&local_68->field_0x2c = op.column_;
    local_68->hash_ = op._24_8_;
    pTVar8 = NextToken((ParserImpl *)left);
    ParseExp(this,left,*pTVar8,(int)&local_68);
    if (local_68 == (String *)0x0) {
      return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)this;
    }
    (*(local_68->super_GCObject)._vptr_GCObject[1])();
    return (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)this;
  }
  __assertion = "left";
  pcVar11 = 
  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseExp(std::unique_ptr<SyntaxTree>, TokenDetail, int)"
  ;
  uVar1 = 0x49;
  goto LAB_00134953;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExp(std::unique_ptr<SyntaxTree> left = std::unique_ptr<SyntaxTree>(),
                                             TokenDetail op = TokenDetail(),
                                             int left_priority = 0)
        {
            std::unique_ptr<SyntaxTree> exp;
            LookAhead();

            if (look_ahead_.token_ == '-' || look_ahead_.token_ == '#' || look_ahead_.token_ == Token_Not)
            {
                NextToken();
                std::unique_ptr<UnaryExpression> unexp(new UnaryExpression);
                unexp->op_token_ = current_;
                unexp->exp_ = ParseExp(std::unique_ptr<SyntaxTree>(), TokenDetail(), 90);
                exp = std::move(unexp);
            }
            else if (IsMainExp(look_ahead_))
                exp = ParseMainExp();
            else
                throw ParseException("unexpect token for exp.", look_ahead_);

            while (true)
            {
                int right_priority = GetOpPriority(LookAhead());
                if (left_priority < right_priority ||
                    (left_priority == right_priority && IsRightAssociation(LookAhead())))
                {
                    exp = ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else if (left_priority == right_priority)
                {
                    if (left_priority == 0)
                        return exp;
                    assert(left);
                    exp = std::unique_ptr<BinaryExpression>(
                        new BinaryExpression(std::move(left), std::move(exp), op));
                    return ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else
                {
                    if (left)
                        exp = std::unique_ptr<BinaryExpression>(
                            new BinaryExpression(std::move(left), std::move(exp), op));
                    return exp;
                }
            }
        }